

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O0

void normalize_suite::normalize_even(void)

{
  size_type *psVar1;
  initializer_list<int> __l;
  initializer_list<int> input;
  iterator pvVar2;
  iterator pvVar3;
  reference piVar4;
  iterator second_begin;
  iterator second_end;
  size_type sVar5;
  iterator iVar6;
  iterator iVar7;
  allocator<int> local_c1;
  int local_c0 [4];
  iterator local_b0;
  size_type local_a8;
  undefined1 local_a0 [8];
  vector<int,_std::allocator<int>_> expect;
  iterator local_78;
  int local_68 [8];
  iterator local_48;
  undefined8 local_40;
  undefined1 local_38 [8];
  circular_view<int,_18446744073709551615UL> span;
  array<int,_4UL> array;
  
  span.member.next = 0;
  psVar1 = &span.member.next;
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  pvVar3 = std::array<int,_4UL>::end((array<int,_4UL> *)psVar1);
  vista::circular_view<int,18446744073709551615ul>::circular_view<int*>
            ((circular_view<int,18446744073709551615ul> *)local_38,pvVar2,pvVar3);
  local_68[0] = 0xb;
  local_68[1] = 0x16;
  local_68[2] = 0x21;
  local_68[3] = 0x2c;
  local_68[4] = 0x37;
  local_48 = local_68;
  local_40 = 5;
  input._M_len = 5;
  input._M_array = local_48;
  vista::circular_view<int,_18446744073709551615UL>::operator=
            ((circular_view<int,_18446744073709551615UL> *)local_38,input);
  local_78 = vista::circular_view<int,_18446744073709551615UL>::begin
                       ((circular_view<int,_18446744073709551615UL> *)local_38);
  piVar4 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     (&local_78);
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) != std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xd6f,"void normalize_suite::normalize_even()",piVar4 != pvVar2);
  vista::circular_view<int,_18446744073709551615UL>::rotate_front
            ((circular_view<int,_18446744073709551615UL> *)local_38);
  join_0x00000010_0x00000000_ =
       vista::circular_view<int,_18446744073709551615UL>::begin
                 ((circular_view<int,_18446744073709551615UL> *)local_38);
  piVar4 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)
                      &expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xd71,"void normalize_suite::normalize_even()",piVar4 == pvVar2);
  local_c0[0] = 0x16;
  local_c0[1] = 0x21;
  local_c0[2] = 0x2c;
  local_c0[3] = 0x37;
  local_b0 = local_c0;
  local_a8 = 4;
  std::allocator<int>::allocator(&local_c1);
  __l._M_len = local_a8;
  __l._M_array = local_b0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_a0,__l,&local_c1);
  std::allocator<int>::~allocator(&local_c1);
  iVar6 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  iVar7 = vista::circular_view<int,_18446744073709551615UL>::end
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  second_begin = std::vector<int,_std::allocator<int>_>::begin
                           ((vector<int,_std::allocator<int>_> *)local_a0);
  second_end = std::vector<int,_std::allocator<int>_>::end
                         ((vector<int,_std::allocator<int>_> *)local_a0);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xd75,"void normalize_suite::normalize_even()",iVar6,iVar7,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             second_begin._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             second_end._M_current);
  iVar6 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  iVar7 = vista::circular_view<int,_18446744073709551615UL>::end
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  psVar1 = &span.member.next;
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  pvVar3 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  sVar5 = vista::circular_view<int,_18446744073709551615UL>::size
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xd77,"void normalize_suite::normalize_even()",iVar6,iVar7,pvVar2,pvVar3 + sVar5);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_a0);
  return;
}

Assistant:

void normalize_even()
{
    std::array<int, 4> array = {};
    circular_view<int> span(array.begin(), array.end());
    {
        // 55 22 33 44 => 22 33 44 55
        span = { 11, 22, 33, 44, 55 };
        BOOST_TEST(std::addressof(*span.begin()) != std::addressof(*array.begin()));
        span.rotate_front();
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));

        std::vector<int> expect = { 22, 33, 44, 55 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          array.begin(), array.begin() + span.size());
    }
}